

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTaskExecutor.h
# Opt level: O0

void HighsTaskExecutor::run_worker(int workerId,HighsTaskExecutor *ptr)

{
  bool bVar1;
  ExecutorHandle *pEVar2;
  HighsSplitDeque **ppHVar3;
  HighsTask *pHVar4;
  HighsTaskExecutor *in_RSI;
  int in_EDI;
  HighsTask *currentTask;
  HighsSplitDeque *localDeque;
  ExecutorHandle *executorHandle;
  HighsTask *in_stack_00000098;
  HighsSplitDeque *in_stack_000000a0;
  HighsSplitDeque *in_stack_ffffffffffffffc8;
  pointer in_stack_ffffffffffffffd0;
  atomic<bool> *in_stack_ffffffffffffffd8;
  
  pEVar2 = threadLocalExecutorHandle();
  pEVar2->ptr = in_RSI;
  bVar1 = std::atomic::operator_cast_to_bool(in_stack_ffffffffffffffd8);
  if (!bVar1) {
    std::
    vector<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>,_std::allocator<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>_>_>
    ::operator[](&in_RSI->workerDeques,(long)in_EDI);
    in_stack_ffffffffffffffd0 =
         std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>::get
                   ((unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_> *)
                    in_stack_ffffffffffffffd0);
    ppHVar3 = threadLocalWorkerDeque();
    *ppHVar3 = in_stack_ffffffffffffffd0;
    std::__shared_ptr_access<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4b7bbf);
    pHVar4 = HighsSplitDeque::WorkerBunk::waitForNewTask
                       ((WorkerBunk *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    while (pHVar4 != (HighsTask *)0x0) {
      HighsSplitDeque::runStolenTask(in_stack_000000a0,in_stack_00000098);
      pHVar4 = random_steal_loop((HighsTaskExecutor *)executorHandle,localDeque);
      if (pHVar4 == (HighsTask *)0x0) {
        std::
        __shared_ptr_access<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x4b7c14);
        pHVar4 = HighsSplitDeque::WorkerBunk::waitForNewTask
                           ((WorkerBunk *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      }
    }
  }
  ExecutorHandle::dispose((ExecutorHandle *)in_stack_ffffffffffffffd0);
  return;
}

Assistant:

static void run_worker(int workerId, HighsTaskExecutor* ptr) {
    auto& executorHandle = threadLocalExecutorHandle();
    executorHandle.ptr = ptr;

    if (!ptr->hasStopped) {
      HighsSplitDeque* localDeque = ptr->workerDeques[workerId].get();
      threadLocalWorkerDeque() = localDeque;

      HighsTask* currentTask = ptr->workerBunk->waitForNewTask(localDeque);
      while (currentTask != nullptr) {
        localDeque->runStolenTask(currentTask);

        currentTask = ptr->random_steal_loop(localDeque);
        if (currentTask != nullptr) continue;

        currentTask = ptr->workerBunk->waitForNewTask(localDeque);
      }
    }

    executorHandle.dispose();
  }